

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<int,_true>_> __thiscall
immutable::rrb_details::rebalance<int,true,5>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_true>_> *left,
          ref<immutable::rrb_details::internal_node<int,_true>_> *centre,
          ref<immutable::rrb_details::internal_node<int,_true>_> *right,uint32_t shift,bool is_top)

{
  uint uVar1;
  internal_node<int,_true> *piVar2;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_left;
  uint32_t top_len;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_all;
  ref<immutable::rrb_details::internal_node<int,_true>_> all;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_50;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_48;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_right;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_count;
  
  all.ptr = internal_node_merge<int,true>(left,centre,right);
  if (all.ptr != (internal_node<int,_true> *)0x0) {
    LOCK();
    uVar1 = ((all.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i;
    ((all.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    right = (ref<immutable::rrb_details::internal_node<int,_true>_> *)(ulong)uVar1;
    UNLOCK();
  }
  create_concat_plan<int,true,5>
            (&node_count,(rrb_details *)&all,
             (ref<immutable::rrb_details::internal_node<int,_true>_> *)&top_len,(uint32_t *)right);
  execute_concat_plan<int,true,5>((rrb_details *)&new_all,&all,&node_count,top_len,shift);
  if (top_len < 0x21) {
    if (is_top) {
      *(internal_node<int,_true> **)this = new_all.ptr;
      if (new_all.ptr != (internal_node<int,_true> *)0x0) {
        LOCK();
        ((new_all.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
             ((new_all.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00121271;
    }
    set_sizes<int,true,5>((rrb_details *)&new_left,&new_all,shift);
    piVar2 = internal_node_new_above1<int,true>(&new_left);
    *(internal_node<int,_true> **)this = piVar2;
    if (piVar2 != (internal_node<int,_true> *)0x0) {
      LOCK();
      (piVar2->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
    }
  }
  else {
    new_left.ptr = internal_node_copy<int,true>(new_all.ptr,0,0x20);
    if (new_left.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((new_left.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
    }
    new_right.ptr = internal_node_copy<int,true>(new_all.ptr,0x20,top_len - 0x20);
    if (new_right.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((new_right.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
    }
    set_sizes<int,true,5>((rrb_details *)&local_48,&new_left,shift);
    set_sizes<int,true,5>((rrb_details *)&local_50,&new_right,shift);
    piVar2 = internal_node_new_above<int,true>(&local_48,&local_50);
    *(internal_node<int,_true> **)this = piVar2;
    if (piVar2 != (internal_node<int,_true> *)0x0) {
      LOCK();
      (piVar2->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
    }
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&local_50);
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&local_48);
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&new_right);
  }
  ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&new_left);
LAB_00121271:
  ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&new_all);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&node_count.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&all);
  return (ref<immutable::rrb_details::internal_node<int,_true>_>)(internal_node<int,_true> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> rebalance(const ref<internal_node<T, atomic_ref_counting>>& left, const ref<internal_node<T, atomic_ref_counting>>& centre, const ref<internal_node<T, atomic_ref_counting>>& right, uint32_t shift, bool is_top)
      {
      ref<internal_node<T, atomic_ref_counting>> all = internal_node_merge(left, centre, right);
      // top_len is children count of the internal node returned.
      uint32_t top_len; // populated through pointer manipulation.

      std::vector<uint32_t> node_count = create_concat_plan<T, atomic_ref_counting, N>(all, &top_len);

      ref<internal_node<T, atomic_ref_counting>> new_all = execute_concat_plan<T, atomic_ref_counting, N>(all, node_count, top_len, shift);
      if (top_len <= bits<N>::rrb_branching)
        {
        if (is_top == false)
          {
          return internal_node_new_above1(set_sizes<T, atomic_ref_counting, N>(new_all, shift));
          }
        else
          {
          return new_all;
          }
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>> new_left = internal_node_copy(new_all.ptr, 0, bits<N>::rrb_branching);
        ref<internal_node<T, atomic_ref_counting>> new_right = internal_node_copy(new_all.ptr, bits<N>::rrb_branching, top_len - bits<N>::rrb_branching);
        return internal_node_new_above<T, atomic_ref_counting>(set_sizes<T, atomic_ref_counting, N>(new_left, shift), set_sizes<T, atomic_ref_counting, N>(new_right, shift));
        }
      }